

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

Variable __thiscall
LiteScript::CreateVariable(LiteScript *this,Memory *memory,int count,char **keys,Variable *values)

{
  Object *this_00;
  uint *extraout_RDX;
  uint *puVar1;
  uint *extraout_RDX_00;
  Variable VVar2;
  undefined1 local_78 [36];
  uint local_54;
  uint local_50;
  uint sz;
  uint i;
  Array *local_40;
  Array *a;
  Variable *local_30;
  Variable *values_local;
  char **keys_local;
  Memory *pMStack_18;
  int count_local;
  Memory *memory_local;
  Variable *v;
  
  a._7_1_ = 0;
  local_30 = values;
  values_local = (Variable *)keys;
  keys_local._4_4_ = count;
  pMStack_18 = memory;
  memory_local = (Memory *)this;
  Memory::Create((Memory *)this,(Type *)memory);
  this_00 = Variable::operator->((Variable *)this);
  local_40 = Object::GetData<LiteScript::Array>(this_00);
  local_54 = keys_local._4_4_;
  puVar1 = extraout_RDX;
  for (local_50 = 0; local_50 < local_54; local_50 = local_50 + 1) {
    Array::operator[]((Array *)local_78,(char *)local_40);
    Variable::operator=((Variable *)(local_78 + 0x10),(Variable *)local_78);
    Variable::~Variable((Variable *)(local_78 + 0x10));
    Variable::~Variable((Variable *)local_78);
    puVar1 = extraout_RDX_00;
  }
  VVar2.nb_ref = puVar1;
  VVar2.obj = (Object *)this;
  return VVar2;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, int count, const char **keys, const Variable *values) {
    Variable v = memory.Create(Type::ARRAY);
    Array& a = v->GetData<Array>();
    for (unsigned int i = 0, sz = (unsigned int)count; i < sz; i++)
        a[keys[i]] = values[i];
    return v;
}